

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_table.h
# Opt level: O3

void __thiscall
charls::golomb_code_table::add_entry(golomb_code_table *this,uint8_t value,golomb_code c)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (8 < c.length_) {
    __assert_fail("static_cast<size_t>(length) <= byte_bit_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/lookup_table.h"
                  ,0x2f,
                  "void charls::golomb_code_table::add_entry(const uint8_t, const golomb_code)");
  }
  bVar2 = 8 - (char)c.length_;
  lVar1 = (ulong)value << (bVar2 & 0x3f);
  uVar3 = 1;
  do {
    if ((this->types_)._M_elems[lVar1 + (uVar3 - 1)].length_ != 0) {
      __assert_fail("types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i].length() == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/lookup_table.h"
                    ,0x33,
                    "void charls::golomb_code_table::add_entry(const uint8_t, const golomb_code)");
    }
    uVar4 = uVar3 >> (bVar2 & 0x3f);
    (this->types_)._M_elems[lVar1 + (uVar3 - 1)] = c;
    uVar3 = uVar3 + 1;
  } while (uVar4 == 0);
  return;
}

Assistant:

void add_entry(const uint8_t value, const golomb_code c) noexcept
    {
        const uint32_t length{c.length()};
        ASSERT(static_cast<size_t>(length) <= byte_bit_count);

        for (size_t i{}; i < conditional_static_cast<size_t>(1U) << (byte_bit_count - length); ++i)
        {
            ASSERT(types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i].length() == 0);
            types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i] = c;
        }
    }